

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

void __thiscall CGraphics_Threaded::FlushVertices(CGraphics_Threaded *this)

{
  bool bVar1;
  CGraphics_Threaded *in_RDI;
  long in_FS_OFFSET;
  int NumVerts;
  CRenderCommand Cmd;
  undefined4 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff88;
  int iVar2;
  undefined1 auStack_58 [60];
  undefined4 local_1c;
  int local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->m_NumVertices == 0) goto LAB_0012e030;
  iVar2 = in_RDI->m_NumVertices;
  in_RDI->m_NumVertices = 0;
  CCommandBuffer::CRenderCommand::CRenderCommand((CRenderCommand *)0x12de9c);
  memcpy(auStack_58,&in_RDI->m_State,0x3c);
  if (in_RDI->m_Drawing == 1) {
    local_1c = 2;
    local_18 = iVar2 / 4;
  }
  else {
    if (in_RDI->m_Drawing != 2) goto LAB_0012e030;
    local_1c = 1;
    local_18 = iVar2 / 2;
  }
  local_10 = CCommandBuffer::AllocData((CCommandBuffer *)in_RDI,in_stack_ffffffffffffff7c);
  if (local_10 == (void *)0x0) {
    KickCommandBuffer(in_RDI);
    local_10 = CCommandBuffer::AllocData((CCommandBuffer *)in_RDI,in_stack_ffffffffffffff7c);
    if (local_10 == (void *)0x0) {
      dbg_msg("graphics","failed to allocate data for vertices");
      goto LAB_0012e030;
    }
  }
  bVar1 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
                    ((CCommandBuffer *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                     (CRenderCommand *)in_RDI);
  if (!bVar1) {
    KickCommandBuffer(in_RDI);
    local_10 = CCommandBuffer::AllocData((CCommandBuffer *)in_RDI,in_stack_ffffffffffffff7c);
    if (local_10 == (void *)0x0) {
      dbg_msg("graphics","failed to allocate data for vertices");
      goto LAB_0012e030;
    }
    bVar1 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
                      ((CCommandBuffer *)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                       (CRenderCommand *)in_RDI);
    if (!bVar1) {
      dbg_msg("graphics","failed to allocate memory for render command");
      goto LAB_0012e030;
    }
  }
  mem_copy(in_RDI,(void *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),0);
LAB_0012e030:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGraphics_Threaded::FlushVertices()
{
	if(m_NumVertices == 0)
		return;

	int NumVerts = m_NumVertices;
	m_NumVertices = 0;

	CCommandBuffer::CRenderCommand Cmd;
	Cmd.m_State = m_State;

	if(m_Drawing == DRAWING_QUADS)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_QUADS;
		Cmd.m_PrimCount = NumVerts/4;
	}
	else if(m_Drawing == DRAWING_LINES)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_LINES;
		Cmd.m_PrimCount = NumVerts/2;
	}
	else
		return;

	Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
	if(Cmd.m_pVertices == 0x0)
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}
	}

	// check if we have enough free memory in the commandbuffer
	if(!m_pCommandBuffer->AddCommand(Cmd))
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}

		if(!m_pCommandBuffer->AddCommand(Cmd))
		{
			dbg_msg("graphics", "failed to allocate memory for render command");
			return;
		}
	}

	mem_copy(Cmd.m_pVertices, m_aVertices, sizeof(CCommandBuffer::CVertex)*NumVerts);
}